

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

bool __thiscall cmCTestHG::UpdateImpl(cmCTestHG *this)

{
  _func_int **pp_Var1;
  cmCTest *pcVar2;
  bool bVar3;
  string *arg;
  pointer pbVar4;
  OutputLogger out;
  vector<const_char_*,_std::allocator<const_char_*>_> hg_update;
  string opts;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_108 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char **local_c8;
  undefined8 uStack_c0;
  long local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_a8._8_8_ = "pull";
  local_98._M_allocated_capacity = 0x7a958d;
  local_98._8_8_ = 0;
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_108,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "pull-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-err> "
            );
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)local_a8,(OutputParser *)local_108,
                      (OutputParser *)local_88,(char *)0x0,Auto);
  local_88._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._24_8_ != &local_60) {
    operator_delete((void *)local_88._24_8_,local_60._M_allocated_capacity + 1);
  }
  local_108._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._24_8_ != &local_e0) {
    operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
  }
  local_c8 = (char **)0x0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_108._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_c8,(char **)local_108);
  local_108._0_8_ = "update";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_c8,(char **)local_108);
  local_108._0_8_ = "-v";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_c8,(char **)local_108);
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pp_Var1 = (_func_int **)(local_108 + 0x10);
  local_108._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"UpdateOptions","");
  cmCTest::GetCTestConfiguration((string *)local_a8,pcVar2,(string *)local_108);
  if ((_func_int **)local_108._0_8_ != pp_Var1) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  if ((char *)local_a8._8_8_ == (char *)0x0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"HGUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_108,pcVar2,(string *)local_88);
    std::__cxx11::string::operator=((string *)local_a8,(string *)local_108);
    if ((_func_int **)local_108._0_8_ != pp_Var1) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
  }
  cmSystemTools::ParseArguments(&local_48,(string *)local_a8);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_108._0_8_ = (pbVar4->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_c8,(char **)local_108);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_108._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_c8,(char **)local_108);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_108,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "update-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "update-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_c8,(OutputParser *)local_108,(OutputParser *)local_88,
                     Auto);
  local_88._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._24_8_ != &local_60) {
    operator_delete((void *)local_88._24_8_,local_60._M_allocated_capacity + 1);
  }
  local_108._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._24_8_ != &local_e0) {
    operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_c8 != (char **)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  return bVar3;
}

Assistant:

bool cmCTestHG::UpdateImpl()
{
  // Use "hg pull" followed by "hg update" to update the working tree.
  {
    const char* hg = this->CommandLineTool.c_str();
    const char* hg_pull[] = { hg, "pull", "-v", nullptr };
    OutputLogger out(this->Log, "pull-out> ");
    OutputLogger err(this->Log, "pull-err> ");
    this->RunChild(&hg_pull[0], &out, &err);
  }

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  std::vector<char const*> hg_update;
  hg_update.push_back(this->CommandLineTool.c_str());
  hg_update.push_back("update");
  hg_update.push_back("-v");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("HGUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    hg_update.push_back(arg.c_str());
  }

  // Sentinel argument.
  hg_update.push_back(nullptr);

  OutputLogger out(this->Log, "update-out> ");
  OutputLogger err(this->Log, "update-err> ");
  return this->RunUpdateCommand(hg_update.data(), &out, &err);
}